

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OldAccumulator.hpp
# Opt level: O2

void __thiscall OpenMD::PotVecAccumulator::add(PotVecAccumulator *this,ElementType *val)

{
  double dVar1;
  uint i;
  size_t sVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  double dVar10;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  sVar2 = (this->super_BaseAccumulator).Count_ + 1;
  auVar12._8_4_ = (int)(sVar2 >> 0x20);
  auVar12._0_8_ = sVar2;
  auVar12._12_4_ = 0x45300000;
  (this->super_BaseAccumulator).Count_ = sVar2;
  dVar7 = (auVar12._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)sVar2) - 4503599627370496.0);
  dVar6 = 0.0;
  for (lVar3 = 0; lVar3 != 7; lVar3 = lVar3 + 1) {
    dVar10 = (this->Avg_).data_[lVar3];
    dVar1 = (this->Avg2_).data_[lVar3];
    (this->Avg_).data_[lVar3] = (val->data_[lVar3] - dVar10) / dVar7 + dVar10;
    (this->Avg2_).data_[lVar3] = (val->data_[lVar3] * val->data_[lVar3] - dVar1) / dVar7 + dVar1;
    dVar10 = val->data_[lVar3];
    (this->Val_).data_[lVar3] = dVar10;
    (this->Total_).data_[lVar3] = dVar10 + (this->Total_).data_[lVar3];
    dVar6 = dVar6 + val->data_[lVar3] * val->data_[lVar3];
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  uVar4 = (this->super_BaseAccumulator).Count_;
  auVar8._8_4_ = (int)(uVar4 >> 0x20);
  auVar8._0_8_ = uVar4;
  auVar8._12_4_ = 0x45300000;
  dVar7 = (double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0;
  dVar10 = auVar8._8_8_ - 1.9342813113834067e+25;
  auVar11._0_8_ = dVar6 - this->AvgLen_;
  auVar11._8_8_ = dVar6 * dVar6 - this->AvgLen2_;
  auVar9._0_8_ = dVar10 + dVar7;
  auVar9._8_8_ = dVar10 + dVar7;
  auVar12 = divpd(auVar11,auVar9);
  this->AvgLen_ = auVar12._0_8_ + this->AvgLen_;
  this->AvgLen2_ = auVar12._8_8_ + this->AvgLen2_;
  if (uVar4 < 2) {
    this->Max_ = dVar6;
    this->Min_ = dVar6;
  }
  else {
    uVar4 = -(ulong)(dVar6 < this->Min_);
    uVar5 = -(ulong)(this->Max_ < dVar6);
    this->Min_ = (RealType)(~uVar4 & (ulong)this->Min_ | (ulong)dVar6 & uVar4);
    this->Max_ = (RealType)(~uVar5 & (ulong)this->Max_ | (ulong)dVar6 & uVar5);
  }
  return;
}

Assistant:

void add(ElementType const& val) {
      Count_++;
      RealType len(0.0);
      for (unsigned int i = 0; i < N_INTERACTION_FAMILIES; i++) {
        Avg_[i] += (val[i] - Avg_[i]) / Count_;
        Avg2_[i] += (val[i] * val[i] - Avg2_[i]) / Count_;
        Val_[i] = val[i];
        Total_[i] += val[i];
        len += val[i] * val[i];
      }
      len = sqrt(len);
      AvgLen_ += (len - AvgLen_) / Count_;
      AvgLen2_ += (len * len - AvgLen2_) / Count_;

      if (Count_ <= 1) {
        Max_ = len;
        Min_ = len;
      } else {
        Max_ = len > Max_ ? len : Max_;
        Min_ = len < Min_ ? len : Min_;
      }
    }